

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O0

size_t __thiscall
Assimp::AMFImporter::PostprocessHelper_GetTextureID_Or_Create
          (AMFImporter *this,string *pID_R,string *pID_G,string *pID_B,string *pID_A)

{
  size_t sVar1;
  bool bVar2;
  __type _Var3;
  ulong uVar4;
  reference __lhs;
  size_type sVar5;
  reference ppCVar6;
  DeadlyImportError *pDVar7;
  undefined1 local_2a8 [8];
  anon_class_24_3_c796a13c CopyTextureData;
  size_t off_b;
  size_t off_g;
  size_t step;
  size_t tex_size;
  undefined1 local_268 [5];
  uint8_t i_1;
  ulong local_248;
  size_t i_e;
  size_t i;
  CAMFImporter_NodeElement_Texture *local_230;
  CAMFImporter_NodeElement_Texture *local_228;
  CAMFImporter_NodeElement_Texture *local_220;
  CAMFImporter_NodeElement_Texture *local_218;
  CAMFImporter_NodeElement *t_tex;
  SPP_Texture converted_texture;
  vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
  src_texture_4check;
  CAMFImporter_NodeElement_Texture *src_texture [4];
  SPP_Texture *tex_convd;
  iterator __end1;
  iterator __begin1;
  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_95;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  string TextureConverted_ID;
  size_t TextureConverted_Index;
  string *pID_A_local;
  string *pID_B_local;
  string *pID_G_local;
  string *pID_R_local;
  AMFImporter *this_local;
  
  std::__cxx11::string::string((string *)local_60);
  uVar4 = std::__cxx11::string::empty();
  if (((((uVar4 & 1) != 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0)) &&
      (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0)) &&
     (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0)) {
    local_95 = 1;
    pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_80,
               "PostprocessHelper_GetTextureID_Or_Create. At least one texture ID must be defined.",
               &local_81);
    DeadlyImportError::DeadlyImportError(pDVar7,&local_80);
    local_95 = 0;
    __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 pID_R,"_");
  std::operator+(&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 pID_G);
  std::operator+(&local_118,&local_138,"_");
  std::operator+(&local_f8,&local_118,pID_B);
  std::operator+(&local_d8,&local_f8,"_");
  std::operator+(&local_b8,&local_d8,pID_A);
  std::__cxx11::string::operator=((string *)local_60,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&__range1);
  TextureConverted_ID.field_2._8_8_ = 0;
  __end1 = std::__cxx11::
           list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
           ::begin(&this->mTexture_Converted);
  tex_convd = (SPP_Texture *)
              std::__cxx11::
              list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
              ::end(&this->mTexture_Converted);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&tex_convd), bVar2) {
    __lhs = std::_List_iterator<Assimp::AMFImporter::SPP_Texture>::operator*(&__end1);
    _Var3 = std::operator==(&__lhs->ID,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60);
    if (_Var3) {
      this_local = (AMFImporter *)TextureConverted_ID.field_2._8_8_;
      goto LAB_005cda3d;
    }
    TextureConverted_ID.field_2._8_8_ = TextureConverted_ID.field_2._8_8_ + 1;
    std::_List_iterator<Assimp::AMFImporter::SPP_Texture>::operator++(&__end1);
  }
  memset(&src_texture_4check.
          super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0x20);
  std::
  vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>::
  vector((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
          *)&converted_texture.Data);
  SPP_Texture::SPP_Texture((SPP_Texture *)&t_tex);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar2 = Find_NodeElement(this,pID_R,ENET_Texture,(CAMFImporter_NodeElement **)&local_218);
    if (!bVar2) {
      Throw_ID_NotFound(this,pID_R);
    }
    src_texture_4check.
    super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_218;
    local_220 = local_218;
    std::
    vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
    ::push_back((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                 *)&converted_texture.Data,&local_220);
  }
  else {
    src_texture_4check.
    super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar2 = Find_NodeElement(this,pID_G,ENET_Texture,(CAMFImporter_NodeElement **)&local_218);
    if (!bVar2) {
      Throw_ID_NotFound(this,pID_G);
    }
    src_texture[0] = local_218;
    local_228 = local_218;
    std::
    vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
    ::push_back((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                 *)&converted_texture.Data,&local_228);
  }
  else {
    src_texture[0] = (CAMFImporter_NodeElement_Texture *)0x0;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar2 = Find_NodeElement(this,pID_B,ENET_Texture,(CAMFImporter_NodeElement **)&local_218);
    if (!bVar2) {
      Throw_ID_NotFound(this,pID_B);
    }
    src_texture[1] = local_218;
    local_230 = local_218;
    std::
    vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
    ::push_back((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                 *)&converted_texture.Data,&local_230);
  }
  else {
    src_texture[1] = (CAMFImporter_NodeElement_Texture *)0x0;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar2 = Find_NodeElement(this,pID_A,ENET_Texture,(CAMFImporter_NodeElement **)&local_218);
    if (!bVar2) {
      Throw_ID_NotFound(this,pID_A);
    }
    src_texture[2] = local_218;
    i = (size_t)local_218;
    std::
    vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
    ::push_back((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                 *)&converted_texture.Data,(value_type *)&i);
  }
  else {
    src_texture[2] = (CAMFImporter_NodeElement_Texture *)0x0;
  }
  sVar5 = std::
          vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
          ::size((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                  *)&converted_texture.Data);
  if (1 < sVar5) {
    i_e = 0;
    sVar5 = std::
            vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
            ::size((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                    *)&converted_texture.Data);
    local_248 = sVar5 - 1;
    for (; i_e < local_248; i_e = i_e + 1) {
      ppCVar6 = std::
                vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                ::operator[]((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                              *)&converted_texture.Data,i_e);
      sVar1 = (*ppCVar6)->Width;
      ppCVar6 = std::
                vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                ::operator[]((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                              *)&converted_texture.Data,i_e + 1);
      if (sVar1 != (*ppCVar6)->Width) {
LAB_005cd52d:
        tex_size._6_1_ = 1;
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_268,
                   "PostprocessHelper_GetTextureID_Or_Create. Source texture must has the same size."
                   ,(allocator *)((long)&tex_size + 7));
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)local_268);
        tex_size._6_1_ = 0;
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      ppCVar6 = std::
                vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                ::operator[]((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                              *)&converted_texture.Data,i_e);
      sVar1 = (*ppCVar6)->Height;
      ppCVar6 = std::
                vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                ::operator[]((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                              *)&converted_texture.Data,i_e + 1);
      if (sVar1 != (*ppCVar6)->Height) goto LAB_005cd52d;
      ppCVar6 = std::
                vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                ::operator[]((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                              *)&converted_texture.Data,i_e);
      sVar1 = (*ppCVar6)->Depth;
      ppCVar6 = std::
                vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                ::operator[]((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                              *)&converted_texture.Data,i_e + 1);
      if (sVar1 != (*ppCVar6)->Depth) goto LAB_005cd52d;
    }
  }
  ppCVar6 = std::
            vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
            ::operator[]((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                          *)&converted_texture.Data,0);
  converted_texture.ID.field_2._8_8_ = (*ppCVar6)->Width;
  ppCVar6 = std::
            vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
            ::operator[]((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                          *)&converted_texture.Data,0);
  converted_texture.Width = (*ppCVar6)->Height;
  ppCVar6 = std::
            vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
            ::operator[]((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                          *)&converted_texture.Data,0);
  converted_texture.Height = (*ppCVar6)->Depth;
  converted_texture.Depth._0_1_ = false;
  for (tex_size._5_1_ = 0; uVar4 = (ulong)tex_size._5_1_,
      sVar5 = std::
              vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
              ::size((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                      *)&converted_texture.Data), uVar4 < sVar5; tex_size._5_1_ = tex_size._5_1_ + 1
      ) {
    ppCVar6 = std::
              vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
              ::operator[]((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                            *)&converted_texture.Data,(ulong)tex_size._5_1_);
    converted_texture.Depth._0_1_ =
         ((byte)converted_texture.Depth & 1) != 0 || ((*ppCVar6)->Tiled & 1U) != 0;
  }
  strcpy((char *)((long)&converted_texture.Depth + 1),"rgba0000");
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    converted_texture.Depth._5_1_ = 0x38;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    converted_texture.Depth._6_1_ = 0x38;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    converted_texture.Depth._7_1_ = 0x38;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    converted_texture.Tiled = true;
  }
  step = 0;
  off_g = 0;
  off_b = 0;
  CopyTextureData.converted_texture = (SPP_Texture *)0x0;
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) &&
     (src_texture_4check.
      super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (src_texture_4check.
                        super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xd));
    step = sVar5 + step;
    off_g = 1;
    off_b = 1;
    CopyTextureData.converted_texture =
         (SPP_Texture *)&((CopyTextureData.converted_texture)->ID).field_0x1;
  }
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) && (src_texture[0] != (CAMFImporter_NodeElement_Texture *)0x0)) {
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&src_texture[0]->Data);
    step = sVar5 + step;
    off_g = off_g + 1;
    CopyTextureData.converted_texture =
         (SPP_Texture *)&((CopyTextureData.converted_texture)->ID).field_0x1;
  }
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) && (src_texture[1] != (CAMFImporter_NodeElement_Texture *)0x0)) {
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&src_texture[1]->Data);
    step = sVar5 + step;
    off_g = off_g + 1;
  }
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) && (src_texture[2] != (CAMFImporter_NodeElement_Texture *)0x0)) {
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&src_texture[2]->Data);
    step = sVar5 + step;
    off_g = off_g + 1;
  }
  converted_texture._64_8_ = operator_new__(step);
  local_2a8 = (undefined1  [8])&step;
  CopyTextureData.tex_size =
       (size_t *)
       &src_texture_4check.
        super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  CopyTextureData.src_texture = (CAMFImporter_NodeElement_Texture *(*) [4])&t_tex;
  PostprocessHelper_GetTextureID_Or_Create::anon_class_24_3_c796a13c::operator()
            ((anon_class_24_3_c796a13c *)local_2a8,pID_R,0,off_g,'\0');
  PostprocessHelper_GetTextureID_Or_Create::anon_class_24_3_c796a13c::operator()
            ((anon_class_24_3_c796a13c *)local_2a8,pID_G,off_b,off_g,'\x01');
  PostprocessHelper_GetTextureID_Or_Create::anon_class_24_3_c796a13c::operator()
            ((anon_class_24_3_c796a13c *)local_2a8,pID_B,(size_t)CopyTextureData.converted_texture,
             off_g,'\x02');
  PostprocessHelper_GetTextureID_Or_Create::anon_class_24_3_c796a13c::operator()
            ((anon_class_24_3_c796a13c *)local_2a8,pID_A,off_g - 1,off_g,'\x03');
  std::__cxx11::string::operator=((string *)&t_tex,(string *)local_60);
  std::__cxx11::
  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>::
  push_back(&this->mTexture_Converted,(value_type *)&t_tex);
  this_local = (AMFImporter *)TextureConverted_ID.field_2._8_8_;
  SPP_Texture::~SPP_Texture((SPP_Texture *)&t_tex);
  std::
  vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>::
  ~vector((vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
           *)&converted_texture.Data);
LAB_005cda3d:
  std::__cxx11::string::~string((string *)local_60);
  return (size_t)this_local;
}

Assistant:

size_t AMFImporter::PostprocessHelper_GetTextureID_Or_Create(const std::string& pID_R, const std::string& pID_G, const std::string& pID_B,
																const std::string& pID_A)
{
    size_t TextureConverted_Index;
    std::string TextureConverted_ID;

	// check input data
	if(pID_R.empty() && pID_G.empty() && pID_B.empty() && pID_A.empty())
		throw DeadlyImportError("PostprocessHelper_GetTextureID_Or_Create. At least one texture ID must be defined.");

	// Create ID
	TextureConverted_ID = pID_R + "_" + pID_G + "_" + pID_B + "_" + pID_A;
	// Check if texture specified by set of IDs is converted already.
	TextureConverted_Index = 0;
	for(const SPP_Texture& tex_convd: mTexture_Converted)
	{
        if ( tex_convd.ID == TextureConverted_ID ) {
            return TextureConverted_Index;
        } else {
            ++TextureConverted_Index;
        }
	}

	//
	// Converted texture not found, create it.
	//
	CAMFImporter_NodeElement_Texture* src_texture[4]{nullptr};
	std::vector<CAMFImporter_NodeElement_Texture*> src_texture_4check;
	SPP_Texture converted_texture;

	{// find all specified source textures
		CAMFImporter_NodeElement* t_tex;

		// R
		if(!pID_R.empty())
		{
			if(!Find_NodeElement(pID_R, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_R);

			src_texture[0] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[0] = nullptr;
		}

		// G
		if(!pID_G.empty())
		{
			if(!Find_NodeElement(pID_G, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_G);

			src_texture[1] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[1] = nullptr;
		}

		// B
		if(!pID_B.empty())
		{
			if(!Find_NodeElement(pID_B, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_B);

			src_texture[2] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[2] = nullptr;
		}

		// A
		if(!pID_A.empty())
		{
			if(!Find_NodeElement(pID_A, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_A);

			src_texture[3] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[3] = nullptr;
		}
	}// END: find all specified source textures

	// check that all textures has same size
	if(src_texture_4check.size() > 1)
	{
		for (size_t i = 0, i_e = (src_texture_4check.size() - 1); i < i_e; i++)
		{
			if((src_texture_4check[i]->Width != src_texture_4check[i + 1]->Width) || (src_texture_4check[i]->Height != src_texture_4check[i + 1]->Height) ||
				(src_texture_4check[i]->Depth != src_texture_4check[i + 1]->Depth))
			{
				throw DeadlyImportError("PostprocessHelper_GetTextureID_Or_Create. Source texture must has the same size.");
			}
		}
	}// if(src_texture_4check.size() > 1)

	// set texture attributes
	converted_texture.Width = src_texture_4check[0]->Width;
	converted_texture.Height = src_texture_4check[0]->Height;
	converted_texture.Depth = src_texture_4check[0]->Depth;
	// if one of source texture is tiled then converted texture is tiled too.
	converted_texture.Tiled = false;
	for(uint8_t i = 0; i < src_texture_4check.size(); i++) converted_texture.Tiled |= src_texture_4check[i]->Tiled;

	// Create format hint.
	strcpy(converted_texture.FormatHint, "rgba0000");// copy initial string.
	if(!pID_R.empty()) converted_texture.FormatHint[4] = '8';
	if(!pID_G.empty()) converted_texture.FormatHint[5] = '8';
	if(!pID_B.empty()) converted_texture.FormatHint[6] = '8';
	if(!pID_A.empty()) converted_texture.FormatHint[7] = '8';

	//
	// Сopy data of textures.
	//
	size_t tex_size = 0;
	size_t step = 0;
	size_t off_g = 0;
	size_t off_b = 0;

	// Calculate size of the target array and rule how data will be copied.
    if(!pID_R.empty() && nullptr != src_texture[ 0 ] ) {
        tex_size += src_texture[0]->Data.size(); step++, off_g++, off_b++;
    }
    if(!pID_G.empty() && nullptr != src_texture[ 1 ] ) {
        tex_size += src_texture[1]->Data.size(); step++, off_b++;
    }
    if(!pID_B.empty() && nullptr != src_texture[ 2 ] ) {
        tex_size += src_texture[2]->Data.size(); step++;
    }
    if(!pID_A.empty() && nullptr != src_texture[ 3 ] ) {
        tex_size += src_texture[3]->Data.size(); step++;
    }

    // Create target array.
	converted_texture.Data = new uint8_t[tex_size];
	// And copy data
	auto CopyTextureData = [&](const std::string& pID, const size_t pOffset, const size_t pStep, const uint8_t pSrcTexNum) -> void
	{
		if(!pID.empty())
		{
			for(size_t idx_target = pOffset, idx_src = 0; idx_target < tex_size; idx_target += pStep, idx_src++) {
				CAMFImporter_NodeElement_Texture* tex = src_texture[pSrcTexNum];
				ai_assert(tex);
				converted_texture.Data[idx_target] = tex->Data.at(idx_src);
			}
		}
	};// auto CopyTextureData = [&](const size_t pOffset, const size_t pStep, const uint8_t pSrcTexNum) -> void

	CopyTextureData(pID_R, 0, step, 0);
	CopyTextureData(pID_G, off_g, step, 1);
	CopyTextureData(pID_B, off_b, step, 2);
	CopyTextureData(pID_A, step - 1, step, 3);

	// Store new converted texture ID
	converted_texture.ID = TextureConverted_ID;
	// Store new converted texture
	mTexture_Converted.push_back(converted_texture);

	return TextureConverted_Index;
}